

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testSamplerTags_Test::TestBody(Sampler_testSamplerTags_Test *this)

{
  Sampler *pSVar1;
  ValueType *pVVar2;
  bool bVar3;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *__x;
  string *psVar4;
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  *this_00;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  *this_01;
  char **rhs;
  ValueType *rhs_00;
  char *pcVar5;
  __0 *local_4e0;
  AssertHelper local_3d0 [8];
  Message local_3c8 [12];
  int local_3bc;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_2;
  Message local_3a0 [8];
  undefined1 local_398 [8];
  AssertionResult gtest_ar_1;
  Message local_380 [8];
  undefined1 local_378 [8];
  AssertionResult gtest_ar;
  AssertionResult local_360 [2];
  AssertHelper local_340 [8];
  Message local_338 [15];
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_;
  Tag *tag;
  const_iterator __end3;
  const_iterator __begin3;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *__range3;
  int count;
  TraceID local_2d0;
  SamplingStatus local_2c0;
  undefined1 local_2a0 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  anon_struct_80_3_42a5a058 *test;
  anon_struct_80_3_42a5a058 *__end2;
  anon_struct_80_3_42a5a058 *__begin2;
  anon_struct_80_3_42a5a058 (*__range2) [4];
  undefined1 *local_260;
  undefined1 local_258 [8];
  anon_struct_80_3_42a5a058 tests [4];
  undefined1 local_110 [8];
  RateLimitingSampler rate;
  ProbabilisticSampler prob;
  undefined1 local_60 [8];
  ConstSampler constFalse;
  ConstSampler constTrue;
  Sampler_testSamplerTags_Test *this_local;
  
  ConstSampler::ConstSampler
            ((ConstSampler *)
             &constFalse._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true);
  ConstSampler::ConstSampler((ConstSampler *)local_60,false);
  ProbabilisticSampler::ProbabilisticSampler
            ((ProbabilisticSampler *)
             &rate._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0.1);
  RateLimitingSampler::RateLimitingSampler((RateLimitingSampler *)local_110,0.1);
  __range2._3_1_ = 1;
  local_260 = local_258;
  local_258 = (undefined1  [8])
              &constFalse._tags.
               super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)tests,"const",(allocator *)((long)&__range2 + 7));
  opentracing::v3::Value::Value((Value *)((long)&tests[0]._samplerType.field_2 + 8),true);
  local_260 = (undefined1 *)((long)&tests[0]._samplerParam.super_variant_type.data + 0x18);
  tests[0]._samplerParam.super_variant_type.data._24_8_ = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(tests + 1),"const",(allocator *)((long)&__range2 + 6));
  opentracing::v3::Value::Value((Value *)((long)&tests[1]._samplerType.field_2 + 8),false);
  local_260 = (undefined1 *)((long)&tests[1]._samplerParam.super_variant_type.data + 0x18);
  tests[1]._samplerParam.super_variant_type.data._24_8_ =
       &rate._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(tests + 2),"probabilistic",(allocator *)((long)&__range2 + 5));
  opentracing::v3::Value::Value<double,_nullptr>
            ((Value *)((long)&tests[2]._samplerType.field_2 + 8),0.1);
  local_260 = (undefined1 *)((long)&tests[2]._samplerParam.super_variant_type.data + 0x18);
  tests[2]._samplerParam.super_variant_type.data._24_8_ = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(tests + 3),"ratelimiting",(allocator *)((long)&__range2 + 4));
  opentracing::v3::Value::Value<double,_nullptr>
            ((Value *)((long)&tests[3]._samplerType.field_2 + 8),0.1);
  __range2._3_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  for (__end2 = (anon_struct_80_3_42a5a058 *)local_258;
      __end2 != (anon_struct_80_3_42a5a058 *)
                ((long)&tests[3]._samplerParam.super_variant_type.data + 0x18); __end2 = __end2 + 1)
  {
    tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)__end2;
    pSVar1 = __end2->_sampler;
    TraceID::TraceID(&local_2d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&count,"op",(allocator *)((long)&__range3 + 7));
    (*pSVar1->_vptr_Sampler[2])(&local_2c0,pSVar1,&local_2d0,&count);
    __x = SamplingStatus::tags(&local_2c0);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_2a0,__x);
    SamplingStatus::~SamplingStatus(&local_2c0);
    std::__cxx11::string::~string((string *)&count);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    __range3._0_4_ = 0;
    __end3 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::begin
                       ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_2a0
                       );
    tag = (Tag *)std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::end
                           ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                            local_2a0);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                                       *)&tag), bVar3) {
      gtest_ar_.message_.ptr_ =
           &__gnu_cxx::
            __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
            ::operator*(&__end3)->_key;
      psVar4 = Tag::key_abi_cxx11_((Tag *)gtest_ar_.message_.ptr_);
      bVar3 = std::operator==(psVar4,"sampler.type");
      if (bVar3) {
        this_00 = (variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
                   *)Tag::value((Tag *)gtest_ar_.message_.ptr_);
        local_329 = opentracing::v3::util::
                    variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
                    ::is<char_const*>(this_00);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_328,&local_329,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
        if (!bVar3) {
          testing::Message::Message(local_338);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (local_360,local_328,"tag.value().is<const char*>()","false");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (local_340,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x59,pcVar5);
          testing::internal::AssertHelper::operator=(local_340,local_338);
          testing::internal::AssertHelper::~AssertHelper(local_340);
          std::__cxx11::string::~string((string *)local_360);
          testing::Message::~Message(local_338);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
        if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_002fecf2;
        psVar4 = &(tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage)->_key;
        this_01 = &Tag::value((Tag *)gtest_ar_.message_.ptr_)->super_variant_type;
        rhs = opentracing::v3::util::
              variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
              ::get<const_char_*,_nullptr>(this_01);
        testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char_const*>
                  ((EqHelper<false> *)local_378,"test._samplerType","tag.value().get<const char*>()"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &psVar4->_M_string_length,rhs);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
        if (!bVar3) {
          testing::Message::Message(local_380);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x5a,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_380)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(local_380);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
        if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_002fecf2;
        __range3._0_4_ = (int)__range3 + 1;
      }
      else {
        psVar4 = Tag::key_abi_cxx11_((Tag *)gtest_ar_.message_.ptr_);
        bVar3 = std::operator==(psVar4,"sampler.param");
        if (bVar3) {
          pVVar2 = &(tags.
                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->_value;
          rhs_00 = Tag::value((Tag *)gtest_ar_.message_.ptr_);
          testing::internal::EqHelper<false>::Compare<opentracing::v3::Value,opentracing::v3::Value>
                    ((EqHelper<false> *)local_398,"test._samplerParam","tag.value()",
                     (Value *)&(pVVar2->super_variant_type).data.__align,rhs_00);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
          if (!bVar3) {
            testing::Message::Message(local_3a0);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x5e,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,local_3a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(local_3a0);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
          if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_002fecf2;
          __range3._0_4_ = (int)__range3 + 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
      ::operator++(&__end3);
    }
    local_3bc = 2;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_3b8,"2","count",&local_3bc,(int *)&__range3);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
    if (!bVar3) {
      testing::Message::Message(local_3c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
      testing::internal::AssertHelper::AssertHelper
                (local_3d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x62,pcVar5);
      testing::internal::AssertHelper::operator=(local_3d0,local_3c8);
      testing::internal::AssertHelper::~AssertHelper(local_3d0);
      testing::Message::~Message(local_3c8);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      gtest_ar.message_.ptr_._4_4_ = 0;
    }
LAB_002fecf2:
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_2a0);
    if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_002fed4a;
  }
  gtest_ar.message_.ptr_._4_4_ = 0;
LAB_002fed4a:
  local_4e0 = (__0 *)(tests[3]._samplerParam.super_variant_type.data.__data + 0x18);
  do {
    local_4e0 = local_4e0 + -0x50;
    TestBody()::$_0::~__0(local_4e0);
  } while (local_4e0 != (__0 *)local_258);
  RateLimitingSampler::~RateLimitingSampler((RateLimitingSampler *)local_110);
  ProbabilisticSampler::~ProbabilisticSampler
            ((ProbabilisticSampler *)
             &rate._tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ConstSampler::~ConstSampler((ConstSampler *)local_60);
  ConstSampler::~ConstSampler
            ((ConstSampler *)
             &constFalse._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Sampler, testSamplerTags)
{
    ConstSampler constTrue(true);
    ConstSampler constFalse(false);
    ProbabilisticSampler prob(0.1);
    RateLimitingSampler rate(0.1);

    const struct {
        Sampler& _sampler;
        std::string _samplerType;
        Tag::ValueType _samplerParam;
    } tests[] = { { constTrue, "const", true },
                  { constFalse, "const", false },
                  { prob, "probabilistic", 0.1 },
                  { rate, "ratelimiting", 0.1 } };

    for (auto&& test : tests) {
        const auto tags =
            test._sampler.isSampled(TraceID(), kTestOperationName).tags();
        auto count = 0;
        for (auto&& tag : tags) {
            if (tag.key() == kSamplerTypeTagKey) {
                ASSERT_TRUE(tag.value().is<const char*>());
                ASSERT_EQ(test._samplerType, tag.value().get<const char*>());
                ++count;
            }
            else if (tag.key() == kSamplerParamTagKey) {
                ASSERT_EQ(test._samplerParam, tag.value());
                ++count;
            }
        }
        ASSERT_EQ(2, count);
    }
}